

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void tmvline4_subclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  pbVar9 = dc_dest;
  iVar5 = dc_count;
  do {
    lVar11 = 0;
    lVar10 = 0;
    pbVar8 = pbVar9;
    do {
      uVar4 = *(uint *)((long)vplce + lVar10);
      uVar7 = (ulong)*(byte *)(*(long *)((long)bufplce + lVar11) +
                              (ulong)(uVar4 >> ((byte)iVar3 & 0x3f)));
      if (uVar7 != 0) {
        uVar4 = (pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar11) + uVar7)] | 0x40100400) -
                pDVar2[*pbVar8];
        uVar6 = uVar4 & 0x40100400;
        uVar4 = uVar6 - (uVar6 >> 5) & uVar4 | 0x1f07c1f;
        *pbVar8 = RGB32k.All[uVar4 >> 0xf & uVar4];
        uVar4 = *(uint *)((long)vplce + lVar10);
      }
      *(uint *)((long)vplce + lVar10) = uVar4 + *(int *)((long)vince + lVar10);
      lVar10 = lVar10 + 4;
      pbVar8 = pbVar8 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar10 != 0x10);
    pbVar9 = pbVar9 + dc_pitch;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void tmvline4_subclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = (fg2rgb[palookupoffse[i][pix]] | 0x40100400) - bg2rgb[dest[i]];
				DWORD b = a;

				b &= 0x40100400;
				b = b - (b >> 5);
				a &= b;
				a |= 0x01f07c1f;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}